

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

void __thiscall cmCTestScriptHandler::cmCTestScriptHandler(cmCTestScriptHandler *this)

{
  cmCTestScriptHandler *this_local;
  
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_01101730;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ConfigurationScripts);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->ScriptProcessScope);
  this->Backup = false;
  this->EmptyBinDir = false;
  this->EmptyBinDirOnce = false;
  std::__cxx11::string::string((string *)&this->SourceDir);
  std::__cxx11::string::string((string *)&this->BinaryDir);
  std::__cxx11::string::string((string *)&this->BackupSourceDir);
  std::__cxx11::string::string((string *)&this->BackupBinaryDir);
  std::__cxx11::string::string((string *)&this->CTestRoot);
  std::__cxx11::string::string((string *)&this->CVSCheckOut);
  std::__cxx11::string::string((string *)&this->CTestCmd);
  std::__cxx11::string::string((string *)&this->UpdateCmd);
  std::__cxx11::string::string((string *)&this->CTestEnv);
  std::__cxx11::string::string((string *)&this->InitialCache);
  std::__cxx11::string::string((string *)&this->CMakeCmd);
  std::__cxx11::string::string((string *)&this->CMOutFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ExtraUpdates);
  this->MinimumInterval = 1800.0;
  this->ContinuousDuration = -1.0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->ScriptStartTime);
  std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>::
  unique_ptr<std::default_delete<cmMakefile>,void>
            ((unique_ptr<cmMakefile,std::default_delete<cmMakefile>> *)&this->Makefile);
  this->ParentMakefile = (cmMakefile *)0x0;
  std::unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>>::
  unique_ptr<std::default_delete<cmGlobalGenerator>,void>
            ((unique_ptr<cmGlobalGenerator,std::default_delete<cmGlobalGenerator>> *)
             &this->GlobalGenerator);
  std::unique_ptr<cmake,std::default_delete<cmake>>::unique_ptr<std::default_delete<cmake>,void>
            ((unique_ptr<cmake,std::default_delete<cmake>> *)&this->CMake);
  return;
}

Assistant:

cmCTestScriptHandler::cmCTestScriptHandler() = default;